

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O1

void __thiscall
QEvdevKeyboardManager::QEvdevKeyboardManager
          (QEvdevKeyboardManager *this,QString *key,QString *specification,QObject *parent)

{
  qsizetype qVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  QLoggingCategory *pQVar4;
  QDeviceDiscovery *pQVar5;
  undefined4 *puVar6;
  QString *device;
  QString *pQVar7;
  QString *device_1;
  long lVar8;
  long in_FS_OFFSET;
  QObject local_f8 [8];
  code *local_f0;
  ImplFn local_e8;
  QObject local_e0 [8];
  QArrayDataPointer<QString> local_d8;
  char *local_c0;
  ParsedSpecification local_b8;
  QString local_68;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_00146708;
  (this->m_spec).d.d = (Data *)0x0;
  (this->m_spec).d.ptr = (char16_t *)0x0;
  (this->m_spec).d.size = 0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_keyboards).v.
  super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_defaultKeymapFile).d.d = (Data *)0x0;
  (this->m_defaultKeymapFile).d.ptr = (char16_t *)0x0;
  (this->m_defaultKeymapFile).d.size = 0;
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)&local_68);
  if ((undefined1 *)local_68.d.size == (undefined1 *)0x0) {
    QString::operator=(&local_68,specification);
  }
  local_b8.args.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.args.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.args.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.devices.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.devices.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.spec.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.devices.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.spec.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.spec.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QEvdevUtil::parseSpecification(&local_b8,&local_68);
  pQVar2 = &((this->m_spec).d.d)->super_QArrayData;
  pcVar3 = (this->m_spec).d.ptr;
  (this->m_spec).d.d = local_b8.spec.d.d;
  (this->m_spec).d.ptr = local_b8.spec.d.ptr;
  qVar1 = (this->m_spec).d.size;
  (this->m_spec).d.size = local_b8.spec.d.size;
  local_b8.spec.d.d = (Data *)pQVar2;
  local_b8.spec.d.ptr = pcVar3;
  local_b8.spec.d.size = qVar1;
  if ((undefined1 *)local_b8.devices.d.size != (undefined1 *)0x0) {
    lVar8 = local_b8.devices.d.size * 0x18;
    pQVar7 = local_b8.devices.d.ptr;
    do {
      addKeyboard(this,pQVar7);
      pQVar7 = pQVar7 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  if ((undefined1 *)local_b8.devices.d.size == (undefined1 *)0x0) {
    pQVar4 = QtPrivateLogging::qLcEvdevKey();
    if (((pQVar4->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_c0 = pQVar4->name;
      local_d8.d._0_4_ = 2;
      local_d8.d._4_4_ = 0;
      local_d8.ptr._0_4_ = 0;
      local_d8.ptr._4_4_ = 0;
      local_d8.size._0_4_ = 0;
      local_d8.size._4_4_ = 0;
      QMessageLogger::debug((char *)&local_d8,"evdevkeyboard: Using device discovery");
    }
    pQVar5 = QDeviceDiscovery::create((QDeviceTypes)0x8,&this->super_QObject);
    if (pQVar5 != (QDeviceDiscovery *)0x0) {
      local_d8.size._0_4_ = 0xaaaaaaaa;
      local_d8.size._4_4_ = 0xaaaaaaaa;
      local_d8.d._0_4_ = 0xaaaaaaaa;
      local_d8.d._4_4_ = 0xaaaaaaaa;
      local_d8.ptr._0_4_ = 0xaaaaaaaa;
      local_d8.ptr._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_d8,pQVar5);
      if (CONCAT44(local_d8.size._4_4_,(undefined4)local_d8.size) != 0) {
        pQVar7 = (QString *)CONCAT44(local_d8.ptr._4_4_,local_d8.ptr._0_4_);
        lVar8 = CONCAT44(local_d8.size._4_4_,(undefined4)local_d8.size) * 0x18;
        do {
          addKeyboard(this,pQVar7);
          pQVar7 = pQVar7 + 1;
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != 0);
      }
      local_f0 = addKeyboard;
      local_e8 = (ImplFn)0x0;
      local_48 = QDeviceDiscovery::deviceDetected;
      local_40 = 0;
      puVar6 = (undefined4 *)operator_new(0x20);
      *puVar6 = 1;
      *(code **)(puVar6 + 2) =
           QtPrivate::
           QCallableObject<void_(QEvdevKeyboardManager::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar6 + 4) = addKeyboard;
      *(undefined8 *)(puVar6 + 6) = 0;
      QObject::connectImpl
                (local_e0,(void **)pQVar5,(QObject *)&local_48,(void **)this,
                 (QSlotObjectBase *)&local_f0,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_e0);
      local_f0 = removeKeyboard;
      local_e8 = (ImplFn)0x0;
      local_48 = QDeviceDiscovery::deviceRemoved;
      local_40 = 0;
      puVar6 = (undefined4 *)operator_new(0x20);
      *puVar6 = 1;
      *(code **)(puVar6 + 2) =
           QtPrivate::
           QCallableObject<void_(QEvdevKeyboardManager::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar6 + 4) = removeKeyboard;
      *(undefined8 *)(puVar6 + 6) = 0;
      QObject::connectImpl
                (local_f8,(void **)pQVar5,(QObject *)&local_48,(void **)this,
                 (QSlotObjectBase *)&local_f0,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_f8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
    }
  }
  if (&(local_b8.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.args.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8.devices.d);
  if (&(local_b8.spec.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.spec.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.spec.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.spec.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.spec.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevKeyboardManager::QEvdevKeyboardManager(const QString &key, const QString &specification, QObject *parent)
    : QObject(parent)
{
    Q_UNUSED(key);


    QString spec = qEnvironmentVariable("QT_QPA_EVDEV_KEYBOARD_PARAMETERS");

    if (spec.isEmpty())
        spec = specification;

    auto parsed = QEvdevUtil::parseSpecification(spec);
    m_spec = std::move(parsed.spec);

    // add all keyboards for devices specified in the argument list
    for (const QString &device : std::as_const(parsed.devices))
        addKeyboard(device);

    if (parsed.devices.isEmpty()) {
        qCDebug(qLcEvdevKey, "evdevkeyboard: Using device discovery");
        if (auto deviceDiscovery = QDeviceDiscovery::create(QDeviceDiscovery::Device_Keyboard, this)) {
            // scan and add already connected keyboards
            const QStringList devices = deviceDiscovery->scanConnectedDevices();
            for (const QString &device : devices)
                addKeyboard(device);

            connect(deviceDiscovery, &QDeviceDiscovery::deviceDetected,
                    this, &QEvdevKeyboardManager::addKeyboard);
            connect(deviceDiscovery, &QDeviceDiscovery::deviceRemoved,
                    this, &QEvdevKeyboardManager::removeKeyboard);
        }
    }
}